

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool despot::option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  ArgStatus AVar7;
  int iVar8;
  int iVar9;
  char *temp_1;
  char *pcVar10;
  char **ppcVar11;
  ulong uVar12;
  char **ppcVar13;
  char *pcVar14;
  char *pcVar15;
  ulong unaff_RBX;
  long lVar16;
  char *temp;
  Descriptor *ctx;
  char *unaff_R13;
  char **ppcVar17;
  char *st2;
  bool bVar18;
  bool bVar19;
  Option option;
  int local_bc;
  char **local_b0;
  Option local_60;
  
  if (numargs == 0 || args == (char **)0x0) {
    iVar9 = 0;
    local_bc = 0;
  }
  else {
    ppcVar11 = &usage->longopt;
    iVar9 = 0;
    local_b0 = args;
    do {
      pcVar10 = *local_b0;
      args = local_b0;
      local_bc = numargs;
      if (pcVar10 == (char *)0x0) goto LAB_0016420c;
      if (*pcVar10 == '-') {
        cVar2 = pcVar10[1];
        if (cVar2 == '-') {
          if (pcVar10[2] == '\0') {
            if (0 < iVar9) {
              pcVar10 = *local_b0;
              lVar16 = 0;
              do {
                local_b0[lVar16] = local_b0[lVar16 + -1];
                local_b0[lVar16 + -1] = pcVar10;
                lVar16 = lVar16 + -1;
              } while (-iVar9 < lVar16);
            }
            local_b0 = local_b0 + 1;
            local_bc = numargs - (uint)(0 < numargs);
            bVar6 = 3;
            goto LAB_001641b2;
          }
        }
        else if (cVar2 == '\0') goto LAB_00163d89;
        bVar18 = cVar2 != '-';
        st2 = pcVar10 + 2;
        if (bVar18) {
          st2 = pcVar10 + 1;
        }
        bVar4 = single_minus_longopt;
        do {
          if ((!bVar18) || ((bVar4 & 1) != 0)) {
            pcVar14 = usage->longopt;
            bVar19 = pcVar14 == (char *)0x0;
            if (bVar19) {
              unaff_RBX = 0;
            }
            else {
              unaff_RBX = 0;
              uVar12 = 0;
              do {
                lVar16 = 0;
                do {
                  pcVar15 = pcVar14 + lVar16;
                  if (*pcVar15 == '\0') {
                    if ((st2[lVar16] == '\0') || (st2[lVar16] == '=')) {
                      unaff_RBX = uVar12 & 0xffffffff;
                      goto LAB_00163e6f;
                    }
                    break;
                  }
                  pcVar1 = st2 + lVar16;
                  lVar16 = lVar16 + 1;
                } while (*pcVar15 == *pcVar1);
                unaff_RBX = (ulong)((int)unaff_RBX + 1);
                pcVar14 = usage[uVar12 + 1].longopt;
                bVar19 = pcVar14 == (char *)0x0;
                uVar12 = uVar12 + 1;
              } while (!bVar19);
            }
LAB_00163e6f:
            if ((0 < min_abbr_len) && (bVar19)) {
              uVar12 = 0;
              ppcVar17 = ppcVar11;
              if ((*ppcVar11 != (char *)0x0) &&
                 (bVar19 = streqabbr(*ppcVar11,st2,(ulong)(uint)min_abbr_len), !bVar19)) {
                uVar5 = 1;
                ppcVar13 = &usage[1].longopt;
                do {
                  ppcVar17 = ppcVar13;
                  uVar12 = uVar5;
                  if (*ppcVar17 == (char *)0x0) break;
                  bVar19 = streqabbr(*ppcVar17,st2,(ulong)(uint)min_abbr_len);
                  uVar5 = (ulong)((int)uVar12 + 1);
                  ppcVar13 = ppcVar17 + 5;
                } while (!bVar19);
              }
              if (*ppcVar17 != (char *)0x0) {
                ppcVar17 = &usage[1].longopt + uVar12 * 5;
                do {
                  ppcVar13 = ppcVar17;
                  if (*ppcVar13 == (char *)0x0) break;
                  bVar19 = streqabbr(*ppcVar13,st2,(ulong)(uint)min_abbr_len);
                  ppcVar17 = ppcVar13 + 5;
                } while (!bVar19);
                if (*ppcVar13 == (char *)0x0) {
                  unaff_RBX = uVar12;
                }
              }
            }
            pcVar14 = st2;
            if (usage[(int)unaff_RBX].longopt != (char *)0x0) {
              bVar18 = false;
            }
            do {
              unaff_R13 = pcVar14 + 1;
              cVar2 = *pcVar14;
              if (cVar2 == '\0') {
                if (numargs == 1) {
                  bVar4 = 0;
                  unaff_R13 = (char *)0x0;
                  goto LAB_00163f7d;
                }
                unaff_R13 = local_b0[1];
                break;
              }
              pcVar14 = unaff_R13;
            } while (cVar2 != '=');
            bVar4 = 0;
          }
LAB_00163f7d:
          pcVar14 = pcVar10;
          if (bVar18) {
            pcVar14 = pcVar10 + 1;
            cVar2 = pcVar10[1];
            if (cVar2 != '\0') {
              pcVar15 = usage->shortopt;
              unaff_RBX = 0;
              while (pcVar15 != (char *)0x0) {
                do {
                  cVar3 = *pcVar15;
                  if (cVar3 == '\0') break;
                  pcVar15 = pcVar15 + 1;
                } while (cVar3 != cVar2);
                if (cVar3 == cVar2) break;
                pcVar15 = usage[unaff_RBX + 1].shortopt;
                unaff_RBX = unaff_RBX + 1;
              }
              unaff_R13 = pcVar10 + 2;
              if (pcVar10[2] == '\0') {
                unaff_R13 = (char *)0x0;
              }
              if ((numargs != 1) && (pcVar10[2] == '\0')) {
                unaff_R13 = local_b0[1];
              }
              goto LAB_00163fee;
            }
            bVar6 = 4;
          }
          else {
LAB_00163fee:
            if (usage[(int)unaff_RBX].shortopt == (char *)0x0) {
              pcVar10 = usage->shortopt;
              if (pcVar10 == (char *)0x0) {
                unaff_RBX = 0;
              }
              else {
                unaff_RBX = 0;
                ctx = usage;
                do {
                  if ((*pcVar10 == '\0') && (*ctx->longopt == '\0')) goto LAB_0016404c;
                  unaff_RBX = unaff_RBX + 1;
                  pcVar10 = ctx[1].shortopt;
                  ctx = ctx + 1;
                } while (pcVar10 != (char *)0x0);
              }
              ctx = (Descriptor *)0x0;
            }
            else {
              ctx = usage + (int)unaff_RBX;
            }
LAB_0016404c:
            if (ctx == (Descriptor *)0x0) {
              bVar6 = 0;
            }
            else {
              Option::init(&local_60,(EVP_PKEY_CTX *)ctx);
              AVar7 = (*ctx->check_arg)(&local_60,print_errors);
              switch(AVar7) {
              case ARG_NONE:
              case ARG_IGNORE:
                local_60.arg = (char *)0x0;
                break;
              case ARG_OK:
                if (((numargs != 1) && (unaff_R13 != (char *)0x0)) && (unaff_R13 == local_b0[1])) {
                  if (0 < iVar9) {
                    pcVar10 = *local_b0;
                    lVar16 = 0;
                    do {
                      local_b0[lVar16] = local_b0[lVar16 + -1];
                      local_b0[lVar16 + -1] = pcVar10;
                      lVar16 = lVar16 + -1;
                    } while (-iVar9 < lVar16);
                  }
                  local_b0 = local_b0 + 1;
                  local_bc = local_bc - (uint)(0 < local_bc);
                }
                bVar18 = false;
                break;
              case ARG_ILLEGAL:
                bVar6 = 1;
                goto LAB_00164147;
              }
              iVar8 = (*action->_vptr_Action[2])();
              bVar6 = (byte)iVar8 ^ 1;
            }
          }
LAB_00164147:
          if (bVar6 != 0) {
            if (bVar6 != 4) goto LAB_001641b2;
            break;
          }
          pcVar10 = pcVar14;
        } while (bVar18);
        if (0 < iVar9) {
          pcVar10 = *local_b0;
          lVar16 = 0;
          do {
            local_b0[lVar16] = local_b0[lVar16 + -1];
            local_b0[lVar16 + -1] = pcVar10;
            lVar16 = lVar16 + -1;
          } while (-iVar9 < lVar16);
        }
        local_b0 = local_b0 + 1;
        local_bc = local_bc - (uint)(0 < local_bc);
        bVar6 = 0;
      }
      else {
LAB_00163d89:
        bVar6 = 3;
        if (gnu) {
          iVar9 = iVar9 + 1;
          local_b0 = local_b0 + 1;
          local_bc = numargs - (uint)(0 < numargs);
          bVar6 = 2;
        }
      }
LAB_001641b2:
      args = local_b0;
      if ((bVar6 != 0) && (bVar6 != 2)) {
        if (bVar6 != 3) {
          return false;
        }
        goto LAB_0016420c;
      }
      numargs = local_bc;
    } while (local_bc != 0);
    local_bc = 0;
  }
LAB_0016420c:
  if ((0 < local_bc) && (*args == (char *)0x0)) {
    local_bc = 0;
  }
  if (local_bc < 0) {
    local_bc = -1;
    ppcVar11 = args;
    do {
      local_bc = local_bc + 1;
      pcVar10 = *ppcVar11;
      ppcVar11 = ppcVar11 + 1;
    } while (pcVar10 != (char *)0x0);
  }
  iVar9 = (*action->_vptr_Action[3])(action,(ulong)(uint)(local_bc + iVar9),args + -(long)iVar9);
  return (bool)(char)iVar9;
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs,
	const char** args, Action& action, bool single_minus_longopt,
	bool print_errors, int min_abbr_len) {
	// protect against NULL pointer
	if (args == 0)
		numargs = 0;

	int nonops = 0;

	while (numargs != 0 && *args != 0) {
		const char* param = *args; // param can be --long-option, -srto or non-option argument

		// in POSIX mode the first non-option argument terminates the option list
		// a lone minus character is a non-option argument
		if (param[0] != '-' || param[1] == 0) {
			if (gnu) {
				++nonops;
				++args;
				if (numargs > 0)
					--numargs;
				continue;
			} else
				break;
		}

		// -- terminates the option list. The -- itself is skipped.
		if (param[1] == '-' && param[2] == 0) {
			shift(args, nonops);
			++args;
			if (numargs > 0)
				--numargs;
			break;
		}

		bool handle_short_options;
		const char* longopt_name;
		if (param[1] == '-') // if --long-option
			{
			handle_short_options = false;
			longopt_name = param + 2;
		} else {
			handle_short_options = true;
			longopt_name = param + 1; //for testing a potential -long-option
		}

		bool try_single_minus_longopt = single_minus_longopt;
		bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

		do // loop over short options in group, for long options the body is executed only once
		{
			int idx;

			const char* optarg;

			/******************** long option **********************/
			if (handle_short_options == false || try_single_minus_longopt) {
				idx = 0;
				while (usage[idx].longopt != 0
					&& !streq(usage[idx].longopt, longopt_name))
					++idx;

				if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
					{
					int i1 = 0;
					while (usage[i1].longopt != 0
						&& !streqabbr(usage[i1].longopt, longopt_name,
							min_abbr_len))
						++i1;
					if (usage[i1].longopt != 0) { // now test if the match is unambiguous by checking for another match
						int i2 = i1 + 1;
						while (usage[i2].longopt != 0
							&& !streqabbr(usage[i2].longopt, longopt_name,
								min_abbr_len))
							++i2;

						if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
							idx = i1;
					}
				}

				// if we found something, disable handle_short_options (only relevant if single_minus_longopt)
				if (usage[idx].longopt != 0)
					handle_short_options = false;

				try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

				optarg = longopt_name;
				while (*optarg != 0 && *optarg != '=')
					++optarg;
				if (*optarg == '=') // attached argument
					++optarg;
				else
					// possibly detached argument
					optarg = (have_more_args ? args[1] : 0);
			}

			/************************ short option ***********************************/
			if (handle_short_options) {
				if (*++param == 0) // point at the 1st/next option character
					break; // end of short option group

				idx = 0;
				while (usage[idx].shortopt != 0
					&& !instr(*param, usage[idx].shortopt))
					++idx;

				if (param[1] == 0) // if the potential argument is separate
					optarg = (have_more_args ? args[1] : 0);
				else
					// if the potential argument is attached
					optarg = param + 1;
			}

			const Descriptor* descriptor = &usage[idx];

			if (descriptor->shortopt == 0) /**************  unknown option ********************/
			{
				// look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
				idx = 0;
				while (usage[idx].shortopt != 0
					&& (usage[idx].shortopt[0] != 0
						|| usage[idx].longopt[0] != 0))
					++idx;
				descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
			}

			if (descriptor != 0) {
				Option option(descriptor, param, optarg);
				switch (descriptor->check_arg(option, print_errors)) {
				case ARG_ILLEGAL:
					return false; // fatal
				case ARG_OK:
					// skip one element of the argument vector, if it's a separated argument
					if (optarg != 0 && have_more_args && optarg == args[1]) {
						shift(args, nonops);
						if (numargs > 0)
							--numargs;
						++args;
					}

					// No further short options are possible after an argument
					handle_short_options = false;

					break;
				case ARG_IGNORE:
				case ARG_NONE:
					option.arg = 0;
					break;
				}

				if (!action.perform(option))
					return false;
			}

		} while (handle_short_options);

		shift(args, nonops);
		++args;
		if (numargs > 0)
			--numargs;

	} // while

	if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
		numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

	if (numargs < 0) // if we don't know the number of remaining non-option arguments
		{   // we need to count them
		numargs = 0;
		while (args[numargs] != 0)
			++numargs;
	}

	return action.finished(numargs + nonops, args - nonops);
}